

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O3

bool __thiscall QObject::event(QObject *this,QEvent *e)

{
  int *piVar1;
  QBasicMutex *this_00;
  __pointer_type copy;
  ushort uVar2;
  QAbstractEventDispatcher *this_01;
  Data *pDVar3;
  TimerInfoV2 *pTVar4;
  qsizetype qVar5;
  QObject *pQVar6;
  QSlotObjectBase *slotObj;
  ulong uVar7;
  QObjectData *pQVar8;
  long in_FS_OFFSET;
  bool bVar9;
  QList<QAbstractEventDispatcher::TimerInfoV2> local_78;
  QScopedPointer<QObjectData,_QScopedPointerDeleter<QObjectData>_> local_58;
  QObject *pQStack_50;
  QMetaTypeInterface *local_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = e->t;
  if (uVar2 < 0x34) {
    if (uVar2 == 1) {
      (*this->_vptr_QObject[7])(this,e);
    }
    else {
      if (uVar2 == 0x16) {
        this_01 = (QAbstractEventDispatcher *)(this->d_ptr).d[1].q_ptr[6]._vptr_QObject;
        bVar9 = true;
        if (this_01 != (QAbstractEventDispatcher *)0x0) {
          local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_78.d.ptr = (TimerInfoV2 *)&DAT_aaaaaaaaaaaaaaaa;
          QAbstractEventDispatcher::timersForObject(&local_78,this_01,this);
          if ((ImplFn)local_78.d.size != (ImplFn)0x0) {
            (**(code **)(*(long *)this_01 + 0x88))(this_01,this);
            qVar5 = local_78.d.size;
            pTVar4 = local_78.d.ptr;
            pDVar3 = local_78.d.d;
            local_78.d.d = (Data *)0x0;
            local_78.d.ptr = (TimerInfoV2 *)0x0;
            local_78.d.size = 0;
            local_58.d = (QObjectData *)0x0;
            pQStack_50 = (QObject *)0x0;
            local_48 = &QtPrivate::QMetaTypeInterfaceWrapper<void>::metaType;
            slotObj = (QSlotObjectBase *)operator_new(0x30);
            (slotObj->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i = 1;
            slotObj->m_impl =
                 QtPrivate::
                 QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/kernel/qobject.cpp:1445:41),_QtPrivate::List<>,_void>
                 ::impl;
            *(QObject **)(slotObj + 1) = this;
            slotObj[1].m_impl = (ImplFn)pDVar3;
            *(TimerInfoV2 **)(slotObj + 2) = pTVar4;
            slotObj[2].m_impl = (ImplFn)qVar5;
            QMetaObject::invokeMethodImpl
                      (this,slotObj,QueuedConnection,1,&local_58.d,(char **)&pQStack_50,&local_48);
          }
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,0x10,0x10);
            }
          }
        }
        goto LAB_002b0542;
      }
      if (uVar2 != 0x2b) {
LAB_002b0521:
        if (uVar2 < 1000) {
          bVar9 = false;
          goto LAB_002b0542;
        }
        (*this->_vptr_QObject[9])(this,e);
        goto LAB_002b053f;
      }
      pQVar6 = (this->d_ptr).d[1].parent;
      if (pQVar6 == (QObject *)0x0) {
        uVar7 = (ulong)(uint)((int)this + (int)(((ulong)this & 0xffffffff) / 0x418) * -0x418);
        this_00 = (QBasicMutex *)((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + uVar7);
        if (*(long *)((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + uVar7) == 0) {
          LOCK();
          bVar9 = (this_00->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
          if (bVar9) {
            (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
          }
          UNLOCK();
          if (!bVar9) goto LAB_002b0312;
        }
        else {
LAB_002b0312:
          QBasicMutex::lockInternal(this_00);
        }
        pQVar8 = (this->d_ptr).d;
        if (pQVar8[1].parent == (QObject *)0x0) {
          pQVar6 = (QObject *)operator_new(0x28);
          pQVar6[1]._vptr_QObject = (_func_int **)0x0;
          pQVar6[1].d_ptr.d = (QObjectData *)0x0;
          pQVar6->_vptr_QObject = (_func_int **)0x0;
          (pQVar6->d_ptr).d = (QObjectData *)0x0;
          pQVar6[2]._vptr_QObject = (_func_int **)0x0;
          LOCK();
          piVar1 = (int *)((long)&pQVar6->_vptr_QObject + 4);
          *piVar1 = *piVar1 + 1;
          UNLOCK();
          pQVar8[1].parent = pQVar6;
          pQVar8 = (this->d_ptr).d;
        }
        pQVar6 = pQVar8[1].parent;
        LOCK();
        copy = (this_00->d_ptr)._q_value._M_b._M_p;
        (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
        UNLOCK();
        if (copy != (__pointer_type)0x1) {
          QBasicMutex::unlockInternalFutex(this_00,copy);
        }
      }
      local_48 = *(QMetaTypeInterface **)&e[1].t;
      local_58.d = (QObjectData *)0x0;
      _local_40 = (Data *)CONCAT44(0xaaaaaaaa,*(undefined4 *)&e[1]._vptr_QEvent);
      if (pQVar6 != (QObject *)0x0) {
        local_58.d = pQVar6[1].d_ptr.d;
        pQVar6[1].d_ptr.d = (QObjectData *)&local_58;
      }
      pQStack_50 = this;
      (*e->_vptr_QEvent[4])(e,this);
      if (pQStack_50 != (QObject *)0x0) {
        (pQStack_50->d_ptr).d[1].parent[1].d_ptr.d = local_58.d;
      }
    }
  }
  else {
    if (1 < uVar2 - 0x44) {
      if (uVar2 == 0x34) {
        (*this->_vptr_QObject[4])(this);
        goto LAB_002b053f;
      }
      if (uVar2 != 0x47) goto LAB_002b0521;
    }
    (*this->_vptr_QObject[8])(this,e);
  }
LAB_002b053f:
  bVar9 = true;
LAB_002b0542:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

bool QObject::event(QEvent *e)
{
    switch (e->type()) {
    case QEvent::Timer:
        timerEvent((QTimerEvent *)e);
        break;

    case QEvent::ChildAdded:
    case QEvent::ChildPolished:
    case QEvent::ChildRemoved:
        childEvent((QChildEvent *)e);
        break;

    case QEvent::DeferredDelete:
        delete this;
        break;

    case QEvent::MetaCall:
        {
            QAbstractMetaCallEvent *mce = static_cast<QAbstractMetaCallEvent*>(e);

            QObjectPrivate::ConnectionData *connections = d_func()->connections.loadAcquire();
            if (!connections) {
                QMutexLocker locker(signalSlotLock(this));
                d_func()->ensureConnectionData();
                connections = d_func()->connections.loadRelaxed();
            }
            QObjectPrivate::Sender sender(this, const_cast<QObject*>(mce->sender()), mce->signalId(), connections);

            mce->placeMetaCall(this);
            break;
        }

    case QEvent::ThreadChange: {
        Q_D(QObject);
        QThreadData *threadData = d->threadData.loadRelaxed();
        QAbstractEventDispatcher *eventDispatcher = threadData->eventDispatcher.loadRelaxed();
        if (eventDispatcher) {
            QList<QAbstractEventDispatcher::TimerInfoV2> timers = eventDispatcher->timersForObject(this);
            if (!timers.isEmpty()) {
                const bool res = eventDispatcher->unregisterTimers(this);
                // do not to release our timer ids back to the pool (since the timer ids are moving to a new thread).
                Q_ASSERT_X(res, Q_FUNC_INFO,
                           "QAbstractEventDispatcher::unregisterTimers() returned false,"
                           " but there are timers associated with this object.");
                auto reRegisterTimers = [this, timers = std::move(timers)]() {
                    QAbstractEventDispatcher *eventDispatcher =
                            d_func()->threadData.loadRelaxed()->eventDispatcher.loadRelaxed();
                    for (const auto &ti : timers)
                        eventDispatcher->registerTimer(ti.timerId, ti.interval, ti.timerType, this);
                };
                QMetaObject::invokeMethod(this, std::move(reRegisterTimers), Qt::QueuedConnection);
            }
        }
        break;
    }

    default:
        if (e->type() >= QEvent::User) {
            customEvent(e);
            break;
        }
        return false;
    }
    return true;
}